

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

ER __thiscall slang::ast::ReturnStatement::evalImpl(ReturnStatement *this,EvalContext *context)

{
  EvalContext *in_RDI;
  ConstantValue *storage;
  SubroutineSymbol *subroutine;
  ConstantValue *in_stack_ffffffffffffffa8;
  Expression *in_stack_ffffffffffffffb8;
  ValueSymbol *in_stack_ffffffffffffffc0;
  EvalContext *in_stack_ffffffffffffffc8;
  
  if ((in_RDI->astCtx).firstTempVar != (TempVarSymbol *)0x0) {
    EvalContext::topFrame((EvalContext *)0x9dbbf9);
    EvalContext::findLocal(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    Expression::eval(in_stack_ffffffffffffffb8,in_RDI);
    slang::ConstantValue::operator=((ConstantValue *)in_RDI,in_stack_ffffffffffffffa8);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x9dbc52);
  }
  return Return;
}

Assistant:

ER ReturnStatement::evalImpl(EvalContext& context) const {
    if (expr) {
        const SubroutineSymbol* subroutine = context.topFrame().subroutine;
        SLANG_ASSERT(subroutine);

        ConstantValue* storage = context.findLocal(subroutine->returnValVar);
        SLANG_ASSERT(storage);

        *storage = expr->eval(context);
    }
    return ER::Return;
}